

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_5d835d::Db::parseOperatorName(Db *this,NameState *State)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  Node *pNVar5;
  Node *pNVar6;
  NameType *pNVar7;
  char *pcVar8;
  undefined **ppuVar9;
  ulong uVar10;
  uint uVar11;
  
  pbVar4 = (byte *)this->First;
  uVar10 = (long)this->Last - (long)pbVar4;
  if ((byte *)this->Last == pbVar4) {
    return (Node *)0x0;
  }
  uVar11 = *pbVar4 - 0x61;
  if (0x15 < uVar11) {
    return (Node *)0x0;
  }
  uVar11 = (&switchD_001d942b::switchdataD_001fe5cc)[uVar11];
  switch((uint)*pbVar4) {
  case 0x61:
    if (1 < uVar10) {
      bVar1 = pbVar4[1];
      if (bVar1 < 0x61) {
        if (bVar1 != 0x4e) {
          if (bVar1 != 0x53) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator=";
          goto LAB_001d9c5d;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator&=";
      }
      else {
        if ((bVar1 == 0x6e) || (bVar1 == 100)) {
          this->First = (char *)(pbVar4 + 2);
          pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
          pNVar5->K = KNameType;
          pNVar5->RHSComponentCache = No;
          pNVar5->ArrayCache = No;
          pNVar5->FunctionCache = No;
          pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
          pNVar5[1]._vptr_Node = (_func_int **)"operator&";
          pcVar8 = "";
          goto LAB_001d9b90;
        }
        if (bVar1 != 0x61) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator&&";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 99:
    if (uVar10 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 < 0x6f) {
      if (bVar1 == 0x6c) {
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator()";
        goto LAB_001d9cc7;
      }
      if (bVar1 != 0x6d) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator,";
    }
    else {
      if (bVar1 != 0x6f) {
        if (bVar1 != 0x76) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        bVar2 = this->TryToParseTemplateArgs;
        bVar3 = this->PermitForwardTemplateReferences;
        this->TryToParseTemplateArgs = false;
        this->PermitForwardTemplateReferences = (bool)(State != (NameState *)0x0 | bVar3);
        pNVar5 = parseType(this);
        if (pNVar5 == (Node *)0x0) {
          pNVar6 = (Node *)0x0;
        }
        else {
          if (State != (NameState *)0x0) {
            State->CtorDtorConversion = true;
          }
          pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
          pNVar6->K = KConversionOperatorType;
          pNVar6->RHSComponentCache = No;
          pNVar6->ArrayCache = No;
          pNVar6->FunctionCache = No;
          pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023ddb8;
          pNVar6[1]._vptr_Node = (_func_int **)pNVar5;
        }
        this->PermitForwardTemplateReferences = bVar3;
        this->TryToParseTemplateArgs = bVar2;
        return pNVar6;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator~";
    }
    goto LAB_001d9c5d;
  case 100:
    if (uVar10 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 < 0x65) {
      if (bVar1 != 0x56) {
        if (bVar1 != 0x61) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[18]>
                           ((Db *)this,(char (*) [18])"operator delete[]");
        return &pNVar7->super_Node;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator/=";
      goto LAB_001d9cc7;
    }
    if (bVar1 != 0x65) {
      if (bVar1 != 0x6c) {
        if (bVar1 != 0x76) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator/";
        goto LAB_001d9c5d;
      }
      this->First = (char *)(pbVar4 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar5->K = KNameType;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
      pNVar5[1]._vptr_Node = (_func_int **)"operator delete";
      pcVar8 = "";
      goto LAB_001d9b90;
    }
    goto LAB_001d99f2;
  case 0x65:
    if (1 < uVar10) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x4f) {
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator^=";
      }
      else {
        if (bVar1 != 0x71) {
          if (bVar1 != 0x6f) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator^";
          goto LAB_001d9c5d;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator==";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 0x67:
    if (1 < uVar10) {
      if (pbVar4[1] == 0x74) {
        this->First = (char *)(pbVar4 + 2);
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar5->K = KNameType;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
        pNVar5[1]._vptr_Node = (_func_int **)"operator>";
        pcVar8 = "";
      }
      else {
        if (pbVar4[1] != 0x65) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
        pNVar5->K = KNameType;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
        pNVar5[1]._vptr_Node = (_func_int **)"operator>=";
        pcVar8 = "";
      }
LAB_001d9b90:
      *(char **)&pNVar5[1].K = pcVar8;
      return pNVar5;
    }
    break;
  case 0x69:
    if ((1 < uVar10) && (pbVar4[1] == 0x78)) {
      this->First = (char *)(pbVar4 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar5->K = KNameType;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
      pNVar5[1]._vptr_Node = (_func_int **)"operator[]";
      pcVar8 = "";
      goto LAB_001d9b90;
    }
    break;
  case 0x6c:
    if (1 < uVar10) {
      bVar1 = pbVar4[1];
      if (bVar1 < 0x69) {
        if (bVar1 == 0x53) {
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator<<=";
          goto LAB_001d9ca9;
        }
        if (bVar1 != 0x65) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator<=";
      }
      else {
        if (bVar1 == 0x69) {
          this->First = (char *)(pbVar4 + 2);
          pNVar5 = parseSourceName(this,(NameState *)
                                        ((long)&switchD_001d942b::switchdataD_001fe5cc +
                                        (long)(int)uVar11));
          if (pNVar5 == (Node *)0x0) {
            return (Node *)0x0;
          }
          pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
          pNVar6->K = KLiteralOperator;
          pNVar6->RHSComponentCache = No;
          pNVar6->ArrayCache = No;
          pNVar6->FunctionCache = No;
          ppuVar9 = &PTR_hasRHSComponentSlow_0023de10;
          goto LAB_001d9be2;
        }
        if (bVar1 != 0x73) {
          if (bVar1 != 0x74) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator<";
          goto LAB_001d9c5d;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator<<";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 0x6d:
    if (uVar10 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 < 0x69) {
      if (bVar1 == 0x49) {
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator-=";
      }
      else {
        if (bVar1 != 0x4c) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator*=";
      }
LAB_001d9cc7:
      pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[11]>
                         ((Db *)this,(char (*) [11])pcVar8);
      return &pNVar7->super_Node;
    }
    if (bVar1 == 0x6d) {
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator--";
      goto LAB_001d9cc7;
    }
    if (bVar1 != 0x6c) {
      if (bVar1 != 0x69) {
        return (Node *)0x0;
      }
      goto LAB_001d9a48;
    }
LAB_001d99f2:
    this->First = (char *)(pbVar4 + 2);
    pcVar8 = "operator*";
LAB_001d9c5d:
    pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[10]>
                       ((Db *)this,(char (*) [10])pcVar8);
    return &pNVar7->super_Node;
  case 0x6e:
    if (uVar10 < 2) {
      return (Node *)0x0;
    }
    bVar1 = pbVar4[1];
    if (bVar1 < 0x67) {
      if (bVar1 == 0x61) {
        this->First = (char *)(pbVar4 + 2);
        pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[15]>
                           ((Db *)this,(char (*) [15])"operator new[]");
        return &pNVar7->super_Node;
      }
      if (bVar1 != 0x65) {
        return (Node *)0x0;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator!=";
      goto LAB_001d9cc7;
    }
    if (bVar1 != 0x67) {
      if (bVar1 != 0x74) {
        if (bVar1 != 0x77) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[13]>
                           ((Db *)this,(char (*) [13])"operator new");
        return &pNVar7->super_Node;
      }
      this->First = (char *)(pbVar4 + 2);
      pcVar8 = "operator!";
      goto LAB_001d9c5d;
    }
LAB_001d9a48:
    this->First = (char *)(pbVar4 + 2);
    pcVar8 = "operator-";
    goto LAB_001d9c5d;
  case 0x6f:
    if (1 < uVar10) {
      bVar1 = pbVar4[1];
      if (bVar1 == 0x52) {
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator|=";
      }
      else {
        if (bVar1 == 0x72) {
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator|";
          goto LAB_001d9c5d;
        }
        if (bVar1 != 0x6f) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator||";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 0x70:
    if (1 < uVar10) {
      switch(pbVar4[1]) {
      case 0x6c:
      case 0x73:
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator+";
        goto LAB_001d9c5d;
      case 0x6d:
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator->*";
LAB_001d9ca9:
        pNVar7 = (anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[12]>
                           ((Db *)this,(char (*) [12])pcVar8);
        return &pNVar7->super_Node;
      case 0x6e:
      case 0x6f:
      case 0x71:
      case 0x72:
        return (Node *)0x0;
      case 0x70:
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator++";
        break;
      case 0x74:
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator->";
        break;
      default:
        if (pbVar4[1] != 0x4c) {
          return (Node *)0x0;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator+=";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 0x71:
    if ((1 < uVar10) && (pbVar4[1] == 0x75)) {
      this->First = (char *)(pbVar4 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar5->K = KNameType;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
      pNVar5[1]._vptr_Node = (_func_int **)"operator?";
      pcVar8 = "";
      goto LAB_001d9b90;
    }
    break;
  case 0x72:
    if (1 < uVar10) {
      bVar1 = pbVar4[1];
      if (bVar1 < 0x6d) {
        if (bVar1 != 0x4d) {
          if (bVar1 != 0x53) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator>>=";
          goto LAB_001d9ca9;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator%=";
      }
      else {
        if (bVar1 != 0x73) {
          if (bVar1 != 0x6d) {
            return (Node *)0x0;
          }
          this->First = (char *)(pbVar4 + 2);
          pcVar8 = "operator%";
          goto LAB_001d9c5d;
        }
        this->First = (char *)(pbVar4 + 2);
        pcVar8 = "operator>>";
      }
      goto LAB_001d9cc7;
    }
    break;
  case 0x73:
    if ((1 < uVar10) && (pbVar4[1] == 0x73)) {
      this->First = (char *)(pbVar4 + 2);
      pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
      pNVar5->K = KNameType;
      pNVar5->RHSComponentCache = No;
      pNVar5->ArrayCache = No;
      pNVar5->FunctionCache = No;
      pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_0023d6d8;
      pNVar5[1]._vptr_Node = (_func_int **)"operator<=>";
      pcVar8 = "";
      goto LAB_001d9b90;
    }
    break;
  case 0x76:
    if ((1 < uVar10) && ((int)(char)pbVar4[1] - 0x30U < 10)) {
      this->First = (char *)(pbVar4 + 2);
      pNVar5 = parseSourceName(this,(NameState *)
                                    ((long)&switchD_001d942b::switchdataD_001fe5cc +
                                    (long)(int)uVar11));
      if (pNVar5 != (Node *)0x0) {
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
        pNVar6->K = KConversionOperatorType;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        ppuVar9 = &PTR_hasRHSComponentSlow_0023ddb8;
LAB_001d9be2:
        pNVar6->_vptr_Node = (_func_int **)ppuVar9;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar5;
        return pNVar6;
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseOperatorName(NameState *State) {
  switch (look()) {
  case 'a':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator&&");
    case 'd':
    case 'n':
      First += 2;
      return make<NameType>("operator&");
    case 'N':
      First += 2;
      return make<NameType>("operator&=");
    case 'S':
      First += 2;
      return make<NameType>("operator=");
    }
    return nullptr;
  case 'c':
    switch (look(1)) {
    case 'l':
      First += 2;
      return make<NameType>("operator()");
    case 'm':
      First += 2;
      return make<NameType>("operator,");
    case 'o':
      First += 2;
      return make<NameType>("operator~");
    //                   ::= cv <type>    # (cast)
    case 'v': {
      First += 2;
      SwapAndRestore<bool> SaveTemplate(TryToParseTemplateArgs, false);
      // If we're parsing an encoding, State != nullptr and the conversion
      // operators' <type> could have a <template-param> that refers to some
      // <template-arg>s further ahead in the mangled name.
      SwapAndRestore<bool> SavePermit(PermitForwardTemplateReferences,
                                      PermitForwardTemplateReferences ||
                                          State != nullptr);
      Node* Ty = parseType();
      if (Ty == nullptr)
        return nullptr;
      if (State) State->CtorDtorConversion = true;
      return make<ConversionOperatorType>(Ty);
    }
    }
    return nullptr;
  case 'd':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator delete[]");
    case 'e':
      First += 2;
      return make<NameType>("operator*");
    case 'l':
      First += 2;
      return make<NameType>("operator delete");
    case 'v':
      First += 2;
      return make<NameType>("operator/");
    case 'V':
      First += 2;
      return make<NameType>("operator/=");
    }
    return nullptr;
  case 'e':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator^");
    case 'O':
      First += 2;
      return make<NameType>("operator^=");
    case 'q':
      First += 2;
      return make<NameType>("operator==");
    }
    return nullptr;
  case 'g':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator>=");
    case 't':
      First += 2;
      return make<NameType>("operator>");
    }
    return nullptr;
  case 'i':
    if (look(1) == 'x') {
      First += 2;
      return make<NameType>("operator[]");
    }
    return nullptr;
  case 'l':
    switch (look(1)) {
    case 'e':
      First += 2;
      return make<NameType>("operator<=");
    //                   ::= li <source-name>  # operator ""
    case 'i': {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<LiteralOperator>(SN);
    }
    case 's':
      First += 2;
      return make<NameType>("operator<<");
    case 'S':
      First += 2;
      return make<NameType>("operator<<=");
    case 't':
      First += 2;
      return make<NameType>("operator<");
    }
    return nullptr;
  case 'm':
    switch (look(1)) {
    case 'i':
      First += 2;
      return make<NameType>("operator-");
    case 'I':
      First += 2;
      return make<NameType>("operator-=");
    case 'l':
      First += 2;
      return make<NameType>("operator*");
    case 'L':
      First += 2;
      return make<NameType>("operator*=");
    case 'm':
      First += 2;
      return make<NameType>("operator--");
    }
    return nullptr;
  case 'n':
    switch (look(1)) {
    case 'a':
      First += 2;
      return make<NameType>("operator new[]");
    case 'e':
      First += 2;
      return make<NameType>("operator!=");
    case 'g':
      First += 2;
      return make<NameType>("operator-");
    case 't':
      First += 2;
      return make<NameType>("operator!");
    case 'w':
      First += 2;
      return make<NameType>("operator new");
    }
    return nullptr;
  case 'o':
    switch (look(1)) {
    case 'o':
      First += 2;
      return make<NameType>("operator||");
    case 'r':
      First += 2;
      return make<NameType>("operator|");
    case 'R':
      First += 2;
      return make<NameType>("operator|=");
    }
    return nullptr;
  case 'p':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator->*");
    case 'l':
      First += 2;
      return make<NameType>("operator+");
    case 'L':
      First += 2;
      return make<NameType>("operator+=");
    case 'p':
      First += 2;
      return make<NameType>("operator++");
    case 's':
      First += 2;
      return make<NameType>("operator+");
    case 't':
      First += 2;
      return make<NameType>("operator->");
    }
    return nullptr;
  case 'q':
    if (look(1) == 'u') {
      First += 2;
      return make<NameType>("operator?");
    }
    return nullptr;
  case 'r':
    switch (look(1)) {
    case 'm':
      First += 2;
      return make<NameType>("operator%");
    case 'M':
      First += 2;
      return make<NameType>("operator%=");
    case 's':
      First += 2;
      return make<NameType>("operator>>");
    case 'S':
      First += 2;
      return make<NameType>("operator>>=");
    }
    return nullptr;
  case 's':
    if (look(1) == 's') {
      First += 2;
      return make<NameType>("operator<=>");
    }
    return nullptr;
  // ::= v <digit> <source-name>        # vendor extended operator
  case 'v':
    if (std::isdigit(look(1))) {
      First += 2;
      Node *SN = parseSourceName(State);
      if (SN == nullptr)
        return nullptr;
      return make<ConversionOperatorType>(SN);
    }
    return nullptr;
  }
  return nullptr;
}